

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody
          (MessageGenerator *this,Printer *printer,bool to_array)

{
  int *piVar1;
  int *piVar2;
  undefined8 *puVar3;
  Descriptor *pDVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  undefined8 *puVar9;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  char *pcVar10;
  MessageGenerator *this_00;
  ulong uVar11;
  __normal_iterator<const_google::protobuf::Descriptor::ExtensionRange_**,_std::vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>_>
  __i;
  undefined8 *puVar12;
  int iVar13;
  long lVar14;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ordered_fields;
  LazySerializerEmitter e;
  undefined8 *local_98;
  undefined8 *puStack_90;
  long local_88;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_80;
  undefined1 local_68 [17];
  bool local_57;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40;
  int local_38;
  
  anon_unknown_0::SortFieldsByNumber(&local_80,this->descriptor_);
  local_98 = (undefined8 *)0x0;
  puStack_90 = (undefined8 *)0x0;
  local_88 = 0;
  pDVar4 = this->descriptor_;
  if (0 < *(int *)(pDVar4 + 0x68)) {
    lVar6 = 0;
    lVar14 = 0;
    do {
      local_68._0_8_ = *(long *)(pDVar4 + 0x70) + lVar6;
      std::
      vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
      ::emplace_back<google::protobuf::Descriptor::ExtensionRange_const*>
                ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                  *)&local_98,(ExtensionRange **)local_68);
      puVar3 = puStack_90;
      puVar9 = local_98;
      lVar14 = lVar14 + 1;
      pDVar4 = this->descriptor_;
      lVar6 = lVar6 + 8;
    } while (lVar14 < *(int *)(pDVar4 + 0x68));
    if (local_98 != puStack_90) {
      lVar14 = (long)puStack_90 - (long)local_98;
      uVar5 = lVar14 >> 3;
      lVar6 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                (local_98,puStack_90,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar14 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                  (puVar9,puVar3);
      }
      else {
        puVar12 = puVar9 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                  (puVar9,puVar12);
        for (; puVar12 != puVar3; puVar12 = puVar12 + 1) {
          piVar1 = (int *)puVar12[-1];
          piVar2 = (int *)*puVar12;
          iVar13 = *piVar2;
          iVar8 = *piVar1;
          puVar9 = puVar12;
          while (iVar13 < iVar8) {
            *puVar9 = piVar1;
            piVar1 = (int *)puVar9[-2];
            puVar9 = puVar9 + -1;
            iVar8 = *piVar1;
          }
          *puVar9 = piVar2;
        }
      }
    }
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,
                       "::google::protobuf::internal::WeakFieldMap::FieldWriter field_writer(_weak_field_map_);\n"
                      );
  }
  io::Printer::Print(printer,
                     "::google::protobuf::uint32 cached_has_bits = 0;\n(void) cached_has_bits;\n\n")
  ;
  local_57 = *(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3;
  local_50._M_allocated_capacity = 0;
  local_50._8_8_ = 0;
  local_40._M_p = (pointer)0x0;
  local_38 = -1;
  iVar13 = 0;
  local_68._0_8_ = this;
  local_68._8_8_ = printer;
  local_68[0x10] = to_array;
  if (puStack_90 == local_98 &&
      local_80.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_80.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    field_00 = (FieldDescriptor *)0x0;
  }
  else {
    uVar5 = (long)puStack_90 - (long)local_98 >> 3;
    uVar7 = 0;
    uVar11 = 0;
    iVar8 = 0;
    field = (FieldDescriptor *)0x0;
    do {
      if (uVar5 == uVar7) {
        field_00 = local_80.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11];
LAB_0025dd11:
        iVar8 = iVar8 + 1;
        if (*(char *)(*(long *)(field_00 + 0x80) + 0x6f) != '\x01') {
          if (field != (FieldDescriptor *)0x0) {
            GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*,bool)::
            LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
                      ((MessageGenerator *)local_68,field);
          }
          GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*,bool)::
          LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
                    ((MessageGenerator *)local_68,field_00);
          goto LAB_0025dd94;
        }
        anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,field_00);
      }
      else {
        if ((iVar8 < *(int *)(this->descriptor_ + 0x2c)) &&
           (field_00 = local_80.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar11],
           *(int *)(field_00 + 0x38) < *(int *)local_98[uVar7])) goto LAB_0025dd11;
        if (field != (FieldDescriptor *)0x0) {
          GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*,bool)::
          LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
                    ((MessageGenerator *)local_68,field);
        }
        this_00 = (MessageGenerator *)local_68;
        GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush
                  ((LazySerializerEmitter *)local_68);
        GenerateSerializeOneExtensionRange
                  (this_00,printer,(ExtensionRange *)local_98[uVar7],to_array);
        iVar13 = iVar13 + 1;
LAB_0025dd94:
        field_00 = (FieldDescriptor *)0x0;
      }
      uVar11 = (ulong)iVar8;
      uVar5 = (long)puStack_90 - (long)local_98 >> 3;
      uVar7 = (ulong)iVar13;
      field = field_00;
    } while ((uVar11 < (ulong)((long)local_80.
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_80.
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3)) ||
            (uVar7 < uVar5));
  }
  if (field_00 != (FieldDescriptor *)0x0) {
    GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*,bool)::LazySerializerEmitter
    ::Emit(google::protobuf::FieldDescriptor_const__(local_68,field_00);
  }
  GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::~LazySerializerEmitter
            ((LazySerializerEmitter *)local_68);
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
    pcVar10 = 
    "output->WriteRaw(unknown_fields().data(),\n                 static_cast<int>(unknown_fields().size()));\n"
    ;
    if (((this->options_).enforce_lite == false) &&
       (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
      io::Printer::Print(printer,"if (_internal_metadata_.have_unknown_fields()) {\n");
      io::Printer::Indent(printer);
      pcVar10 = 
      "::google::protobuf::internal::WireFormat::SerializeUnknownFields(\n    unknown_fields(), output);\n"
      ;
      if (to_array) {
        pcVar10 = 
        "target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(\n    unknown_fields(), target);\n"
        ;
      }
      io::Printer::Print(printer,pcVar10);
      io::Printer::Outdent(printer);
      pcVar10 = "}\n";
    }
    io::Printer::Print(printer,pcVar10);
  }
  if (local_98 != (undefined8 *)0x0) {
    operator_delete(local_98,local_88 - (long)local_98);
  }
  if (local_80.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateSerializeWithCachedSizesBody(io::Printer* printer, bool to_array) {
  // If there are multiple fields in a row from the same oneof then we
  // coalesce them and emit a switch statement.  This is more efficient
  // because it lets the C++ compiler know this is a "at most one can happen"
  // situation. If we emitted "if (has_x()) ...; if (has_y()) ..." the C++
  // compiler's emitted code might check has_y() even when has_x() is true.
  class LazySerializerEmitter {
   public:
    LazySerializerEmitter(MessageGenerator* mg, io::Printer* printer,
                          bool to_array)
        : mg_(mg),
          printer_(printer),
          to_array_(to_array),
          eager_(!HasFieldPresence(mg->descriptor_->file())),
          cached_has_bit_index_(-1) {}

    ~LazySerializerEmitter() { Flush(); }

    // If conditions allow, try to accumulate a run of fields from the same
    // oneof, and handle them at the next Flush().
    void Emit(const FieldDescriptor* field) {
      if (eager_ || MustFlush(field)) {
        Flush();
      }
      if (field->containing_oneof() == NULL) {
        // TODO(ckennelly): Defer non-oneof fields similarly to oneof fields.

        if (!field->options().weak() && !field->is_repeated() && !eager_) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;

            printer_->Print(
                "cached_has_bits = _has_bits_[$new_index$];\n",
                "new_index", SimpleItoa(new_index));

            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(
            printer_, field, to_array_, cached_has_bit_index_);
      } else {
        v_.push_back(field);
      }
    }

    void Flush() {
      if (!v_.empty()) {
        mg_->GenerateSerializeOneofFields(printer_, v_, to_array_);
        v_.clear();
      }
    }

   private:
    // If we have multiple fields in v_ then they all must be from the same
    // oneof.  Would adding field to v_ break that invariant?
    bool MustFlush(const FieldDescriptor* field) {
      return !v_.empty() &&
             v_[0]->containing_oneof() != field->containing_oneof();
    }

    MessageGenerator* mg_;
    io::Printer* printer_;
    const bool to_array_;
    const bool eager_;
    std::vector<const FieldDescriptor*> v_;

    // cached_has_bit_index_ maintains that:
    //   cached_has_bits = from._has_bits_[cached_has_bit_index_]
    // for cached_has_bit_index_ >= 0
    int cached_has_bit_index_;
  };

  std::vector<const FieldDescriptor*> ordered_fields =
      SortFieldsByNumber(descriptor_);

  std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  std::sort(sorted_extensions.begin(), sorted_extensions.end(),
            ExtensionRangeSorter());
  if (num_weak_fields_) {
    printer->Print(
        "::google::protobuf::internal::WeakFieldMap::FieldWriter field_writer("
        "_weak_field_map_);\n");
  }

  printer->Print(
      "::google::protobuf::uint32 cached_has_bits = 0;\n"
      "(void) cached_has_bits;\n\n");

  // Merge the fields and the extension ranges, both sorted by field number.
  {
    LazySerializerEmitter e(this, printer, to_array);
    const FieldDescriptor* last_weak_field = NULL;
    int i, j;
    for (i = 0, j = 0;
         i < ordered_fields.size() || j < sorted_extensions.size();) {
      if ((j == sorted_extensions.size()) ||
          (i < descriptor_->field_count() &&
           ordered_fields[i]->number() < sorted_extensions[j]->start)) {
        const FieldDescriptor* field = ordered_fields[i++];
        if (field->options().weak()) {
          last_weak_field = field;
          PrintFieldComment(printer, field);
        } else {
          if (last_weak_field != NULL) {
            e.Emit(last_weak_field);
            last_weak_field = NULL;
          }
          e.Emit(field);
        }
      } else  {
        if (last_weak_field != NULL) {
          e.Emit(last_weak_field);
          last_weak_field = NULL;
        }
        e.Flush();
        GenerateSerializeOneExtensionRange(printer,
                                           sorted_extensions[j++],
                                           to_array);
      }
    }
    if (last_weak_field != NULL) {
      e.Emit(last_weak_field);
    }
  }

  if (PreserveUnknownFields(descriptor_)) {
    if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      printer->Print("if (_internal_metadata_.have_unknown_fields()) {\n");
      printer->Indent();
      if (to_array) {
        printer->Print(
          "target = "
              "::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(\n"
          "    unknown_fields(), target);\n");
      } else {
        printer->Print(
          "::google::protobuf::internal::WireFormat::SerializeUnknownFields(\n"
          "    unknown_fields(), output);\n");
      }
      printer->Outdent();

      printer->Print(
        "}\n");
    } else {
      printer->Print(
        "output->WriteRaw(unknown_fields().data(),\n"
        "                 static_cast<int>(unknown_fields().size()));\n");
    }
  }
}